

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::setTimeout(CommsInterface *this,milliseconds timeOut)

{
  bool bVar1;
  CommsInterface *in_RSI;
  CommsInterface *in_RDI;
  CommsInterface *this_00;
  
  this_00 = in_RDI;
  bVar1 = propertyLock(in_RSI);
  if (bVar1) {
    (in_RDI->connectionTimeout).__r = (rep)in_RSI;
    propertyUnLock(this_00);
  }
  return;
}

Assistant:

void CommsInterface::setTimeout(std::chrono::milliseconds timeOut)
{
    if (propertyLock()) {
        connectionTimeout = timeOut;
        propertyUnLock();
    }
}